

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O2

void blowfish_ssh2_encrypt_blk(ssh_cipher *cipher,void *blk,int len)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint8_t *p;
  uint uVar4;
  uint32_t out [2];
  uint local_40;
  uint local_3c;
  ssh_cipher *local_38;
  
  if ((len & 7U) == 0) {
    uVar4 = *(uint *)&cipher[-1].vt;
    uVar3 = *(uint *)((long)&cipher[-1].vt + 4);
    local_38 = cipher;
    for (; 0 < len; len = len + -8) {
      uVar1 = GET_32BIT_MSB_FIRST(blk);
      uVar2 = GET_32BIT_MSB_FIRST((undefined1 *)((long)blk + 4));
      blowfish_encrypt(uVar1 ^ uVar4,uVar3 ^ uVar2,&local_40,(BlowfishContext *)(cipher + -0x20a));
      *(ushort *)((long)blk + 2) = (ushort)local_40 << 8 | (ushort)local_40 >> 8;
      *(char *)((long)blk + 1) = (char)(local_40 >> 0x10);
      *(char *)blk = (char)(local_40 >> 0x18);
      *(char *)((long)blk + 7) = (char)local_3c;
      *(char *)((long)blk + 6) = (char)(local_3c >> 8);
      *(char *)((long)blk + 5) = (char)(local_3c >> 0x10);
      *(char *)((long)blk + 4) = (char)(local_3c >> 0x18);
      blk = (void *)((long)blk + 8);
      uVar4 = local_40;
      uVar3 = local_3c;
    }
    *(uint *)&local_38[-1].vt = uVar4;
    *(uint *)((long)&local_38[-1].vt + 4) = uVar3;
    return;
  }
  __assert_fail("(len & 7) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/blowfish.c"
                ,0x17d,"void blowfish_msb_encrypt_cbc(unsigned char *, int, BlowfishContext *)");
}

Assistant:

static void blowfish_ssh2_encrypt_blk(ssh_cipher *cipher, void *blk, int len)
{
    struct blowfish_ctx *ctx = container_of(cipher, struct blowfish_ctx, ciph);
    blowfish_msb_encrypt_cbc(blk, len, &ctx->context);
}